

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

ON_RevSurface * __thiscall ON_RevSurface::Duplicate(ON_RevSurface *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_RevSurface *this_local;
  
  iVar1 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[2])();
  return (ON_RevSurface *)CONCAT44(extraout_var,iVar1);
}

Assistant:

void ON_RevSurface::DestroyRuntimeCache( bool bDelete )
{
  ON_Surface::DestroyRuntimeCache(bDelete);
  if ( 0 != m_curve )
    m_curve->DestroyRuntimeCache(bDelete);
  // 15 August 2003 Dale Lear
  //    Added the call to destroy m_bbox.
  m_bbox.Destroy();
}